

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O3

RepeatedFieldRef<google::protobuf::Message,_void> * __thiscall
google::protobuf::Reflection::GetRepeatedFieldRef<google::protobuf::Message>
          (RepeatedFieldRef<google::protobuf::Message,_void> *__return_storage_ptr__,
          Reflection *this,Message *message,FieldDescriptor *field)

{
  Metadata MVar1;
  
  MVar1 = Message::GetMetadata(message);
  if (MVar1.reflection == this) {
    RepeatedFieldRef<google::protobuf::Message,_void>::RepeatedFieldRef
              (__return_storage_ptr__,message,field);
    return __return_storage_ptr__;
  }
  GetRepeatedFieldRef<google::protobuf::Message>();
}

Assistant:

RepeatedFieldRef<T> Reflection::GetRepeatedFieldRef(
    const Message& message, const FieldDescriptor* field) const {
  ABSL_DCHECK_EQ(message.GetReflection(), this);
  return RepeatedFieldRef<T>(message, field);
}